

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigproc.cc
# Opt level: O0

float sptk::snack::wind_energy
                (float *data,int size,int w_type,int *nwindp,float **dwindp,int *n0p,float **dinp,
                int *wsizep,float **windp)

{
  float **dinp_00;
  int *in_RCX;
  int in_ESI;
  float **in_RDI;
  float *in_R8;
  undefined8 in_R9;
  double dVar1;
  int i;
  float f;
  float sum;
  float *dp;
  float *dwind;
  int nwind;
  size_t in_stack_ffffffffffffff98;
  void *in_stack_ffffffffffffffa0;
  int local_54;
  float local_4c;
  int *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar2;
  
  iVar2 = *in_RCX;
  dinp_00 = *(float ***)in_R8;
  if (iVar2 < in_ESI) {
    if (dinp_00 == (float **)0x0) {
      dinp_00 = (float **)ckalloc(0x13cbf4);
    }
    else {
      dinp_00 = (float **)ckrealloc(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
    if (dinp_00 == (float **)0x0) {
      fprintf(_stderr,"Can\'t allocate scratch memory in wind_energy()\n");
      return 0.0;
    }
    *(float ***)in_R8 = dinp_00;
  }
  if (iVar2 != in_ESI) {
    xget_window(in_R8,(int)((ulong)in_R9 >> 0x20),(int)in_R9,
                (int *)CONCAT44(iVar2,in_stack_ffffffffffffffc8),dinp_00,in_stack_ffffffffffffffb8,
                in_RDI);
    *in_RCX = in_ESI;
  }
  local_4c = 0.0;
  local_54 = in_ESI;
  while (0 < local_54) {
    local_4c = *(float *)dinp_00 * *(float *)in_RDI * *(float *)dinp_00 * *(float *)in_RDI +
               local_4c;
    local_54 = local_54 + -1;
    dinp_00 = (float **)((long)dinp_00 + 4);
    in_RDI = (float **)((long)in_RDI + 4);
  }
  dVar1 = sqrt((double)(local_4c / (float)in_ESI));
  return (float)dVar1;
}

Assistant:

float wind_energy(float *data, int size, int w_type, int *nwindp,
                  float **dwindp, int *n0p, float **dinp, int *wsizep,
                  float **windp)
#endif
{
#if 0
  static int nwind = 0;
  static float *dwind = NULL;
#else
  int nwind = *nwindp;
  float *dwind = *dwindp;
#endif
  register float *dp, sum, f;
  register int i;

  if(nwind < size) {
    if(dwind) dwind = (float*)ckrealloc((void *)dwind,size*sizeof(float));
    else dwind = (float*)ckalloc(size*sizeof(float));
    if(!dwind) {
      Fprintf(stderr,"Can't allocate scratch memory in wind_energy()\n");
      return(0.0);
    }
#if 1
    *dwindp = dwind;
#endif
  }
  if(nwind != size) {
#if 0
    xget_window(dwind, size, w_type);
    nwind = size;
#else
    xget_window(dwind, size, w_type, n0p, dinp, wsizep, windp);
    *nwindp = size;
#endif
  }
  for(i=size, dp = dwind, sum = 0.0; i-- > 0; ) {
    f = *dp++ * (float)(*data++);
    sum += f*f;
  }
  return((float)sqrt((double)(sum/size)));
}